

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O3

void __thiscall OPL::DOSBox::DBOPL::Channel::UpdateFrequency(Channel *this,Chip *chip,Bit8u fourOp)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = this->chanData;
  uVar1 = uVar2 >> 8;
  if ((chip->reg08 & 0x40) == 0) {
    uVar1 = uVar2 >> 9;
  }
  uVar2 = (uint)(byte)KslTable[(uVar2 & 0xffff) >> 6] << 0x10 |
          (uVar1 & 1 | uVar2 >> 9 & 0xe) << 0x18 | uVar2 & 0xffff;
  SetChanData(this,chip,uVar2);
  if ((fourOp & 0x3f) != 0) {
    SetChanData(this + 1,chip,uVar2);
    return;
  }
  return;
}

Assistant:

void Channel::UpdateFrequency( const Chip* chip, Bit8u fourOp ) {
	//Extrace the frequency bits
	Bit32u data = chanData & 0xffff;
	Bit32u kslBase = KslTable[ data >> 6 ];
	Bit32u keyCode = ( data & 0x1c00) >> 9;
	if ( chip->reg08 & 0x40 ) {
		keyCode |= ( data & 0x100)>>8;	/* notesel == 1 */
	} else {
		keyCode |= ( data & 0x200)>>9;	/* notesel == 0 */
	}
	//Add the keycode and ksl into the highest bits of chanData
	data |= (keyCode << SHIFT_KEYCODE) | ( kslBase << SHIFT_KSLBASE );
	( this + 0 )->SetChanData( chip, data );
	if ( fourOp & 0x3f ) {
		( this + 1 )->SetChanData( chip, data );
	}
}